

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

char * __thiscall QFileSystemModelPrivate::index(QFileSystemModelPrivate *this,char *__s,int __c)

{
  QFileSystemNode *this_00;
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  QString *childName;
  
  childName = (QString *)CONCAT44(in_register_00000014,__c);
  if (((childName == (QString *)0x0) ||
      (this_00 = (QFileSystemNode *)childName[2].d.size,
      (QString *)(__s + 0x138) == childName || this_00 == (QFileSystemNode *)0x0)) ||
     (*(char *)((long)&childName[3].d.d + 5) == '\0')) {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    *(undefined8 *)&this->field_0x10 = 0;
  }
  else {
    cVar1 = __s[8];
    cVar2 = __s[9];
    cVar3 = __s[10];
    cVar4 = __s[0xb];
    cVar5 = __s[0xc];
    cVar6 = __s[0xd];
    cVar7 = __s[0xe];
    cVar8 = __s[0xf];
    iVar9 = QFileSystemNode::visibleLocation(this_00,childName);
    iVar9 = translateVisibleLocation((QFileSystemModelPrivate *)__s,this_00,iVar9);
    *(int *)this = iVar9;
    *(undefined4 *)&this->field_0x4 = in_ECX;
    *(QString **)&this->field_0x8 = childName;
    this->field_0x10 = cVar1;
    this->field_0x11 = cVar2;
    this->field_0x12 = cVar3;
    this->field_0x13 = cVar4;
    this->field_0x14 = cVar5;
    this->field_0x15 = cVar6;
    this->field_0x16 = cVar7;
    this->field_0x17 = cVar8;
  }
  return (char *)this;
}

Assistant:

QModelIndex QFileSystemModelPrivate::index(const QFileSystemModelPrivate::QFileSystemNode *node, int column) const
{
    Q_Q(const QFileSystemModel);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = (node ? node->parent : nullptr);
    if (node == &root || !parentNode)
        return QModelIndex();

    // get the parent's row
    Q_ASSERT(node);
    if (!node->isVisible)
        return QModelIndex();

    int visualRow = translateVisibleLocation(parentNode, parentNode->visibleLocation(node->fileName));
    return q->createIndex(visualRow, column, const_cast<QFileSystemNode*>(node));
}